

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O2

void tst_signal_onDestruction(void)

{
  uint __line;
  Node *pNVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  char *__assertion;
  undefined **local_28;
  OnSignalIncrement increment;
  
  pNVar1 = rengine::Node::create();
  local_28 = &PTR__SignalHandler_00115bd8;
  increment.super_SignalHandler<>._vptr_SignalHandler._0_4_ = 0;
  rengine::Signal<>::connect
            (&rengine::SignalEmitter::onDestruction,(int)pNVar1,(sockaddr *)&local_28,in_ECX);
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(int)increment.super_SignalHandler<>._vptr_SignalHandler);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::endl<char,std::char_traits<char>>(poVar2);
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
      __assertion = "(increment.value) == (0)";
      __line = 0x68;
      goto LAB_0010e846;
    }
  }
  (*(pNVar1->super_SignalEmitter)._vptr_SignalEmitter[2])(pNVar1);
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(int)increment.super_SignalHandler<>._vptr_SignalHandler);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,"\'");
    std::endl<char,std::char_traits<char>>(poVar2);
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
      __assertion = "(increment.value) == (1)";
      __line = 0x6a;
LAB_0010e846:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,__line,"void tst_signal_onDestruction()");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"void tst_signal_onDestruction()");
  poVar2 = std::operator<<(poVar2,": ok");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void tst_signal_onDestruction()
{
    Node *node = Node::create();

    OnSignalIncrement increment;
    SignalEmitter::onDestruction.connect(node, &increment);

    check_equal(increment.value, 0);
    node->destroy();
    check_equal(increment.value, 1);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}